

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.h
# Opt level: O2

char16_t * __thiscall icu_63::UnicodeString::getBuffer(UnicodeString *this)

{
  if ((*(ushort *)(this + 8) & 0x11) != 0) {
    return (char16_t *)0x0;
  }
  if ((*(ushort *)(this + 8) & 2) == 0) {
    return *(char16_t **)(this + 0x18);
  }
  return (char16_t *)(this + 10);
}

Assistant:

inline const char16_t *
UnicodeString::getBuffer() const {
  if(fUnion.fFields.fLengthAndFlags&(kIsBogus|kOpenGetBuffer)) {
    return nullptr;
  } else if(fUnion.fFields.fLengthAndFlags&kUsingStackBuffer) {
    return fUnion.fStackFields.fBuffer;
  } else {
    return fUnion.fFields.fArray;
  }
}